

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::NamePattern::NamePattern(NamePattern *this,string *name)

{
  byte bVar1;
  string *in_RDI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *paVar2;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  string *s;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  allocator local_89;
  string local_88 [32];
  string local_68 [39];
  allocator local_41;
  string local_40 [64];
  
  Pattern::Pattern((Pattern *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  *(undefined ***)in_RDI = &PTR__NamePattern_002c2230;
  s = (string *)&in_RDI->field_2;
  toLower((string *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  *(undefined4 *)&in_RDI[1].field_2 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"*",&local_41);
  bVar1 = startsWith(s,in_RDI);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)&in_RDI->field_2);
    std::__cxx11::string::operator=((string *)(in_RDI->field_2)._M_local_buf,local_68);
    std::__cxx11::string::~string(local_68);
    *(undefined4 *)&in_RDI[1].field_2 = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"*",&local_89);
  bVar1 = endsWith(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  if ((bVar1 & 1) != 0) {
    paVar2 = &in_RDI->field_2;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff50,(ulong)paVar2);
    std::__cxx11::string::operator=
              ((string *)(in_RDI->field_2)._M_local_buf,(string *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    *(uint *)&in_RDI[1].field_2 = *(uint *)&in_RDI[1].field_2 | 2;
  }
  return;
}

Assistant:

NamePattern( std::string const& name ) : m_name( toLower( name ) ), m_wildcard( NoWildcard ) {
                if( startsWith( m_name, "*" ) ) {
                    m_name = m_name.substr( 1 );
                    m_wildcard = WildcardAtStart;
                }
                if( endsWith( m_name, "*" ) ) {
                    m_name = m_name.substr( 0, m_name.size()-1 );
                    m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
                }
            }